

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# masked_sad_intrin_ssse3.c
# Opt level: O0

uint aom_masked_sad64x16_ssse3
               (uint8_t *src,int src_stride,uint8_t *ref,int ref_stride,uint8_t *second_pred,
               uint8_t *msk,int msk_stride,int invert_mask)

{
  int in_stack_00000010;
  int in_stack_000000a4;
  uint8_t *in_stack_000000a8;
  int in_stack_000000b4;
  uint8_t *in_stack_000000b8;
  int in_stack_000000c4;
  uint8_t *in_stack_000000c8;
  uint8_t *in_stack_000002c0;
  int in_stack_000002c8;
  int in_stack_000002d0;
  int in_stack_000002d8;
  undefined4 local_4;
  
  if (in_stack_00000010 == 0) {
    local_4 = masked_sad_ssse3(in_stack_000000c8,in_stack_000000c4,in_stack_000000b8,
                               in_stack_000000b4,in_stack_000000a8,in_stack_000000a4,
                               in_stack_000002c0,in_stack_000002c8,in_stack_000002d0,
                               in_stack_000002d8);
  }
  else {
    local_4 = masked_sad_ssse3(in_stack_000000c8,in_stack_000000c4,in_stack_000000b8,
                               in_stack_000000b4,in_stack_000000a8,in_stack_000000a4,
                               in_stack_000002c0,in_stack_000002c8,in_stack_000002d0,
                               in_stack_000002d8);
  }
  return local_4;
}

Assistant:

static inline unsigned int masked_sad_ssse3(const uint8_t *src_ptr,
                                            int src_stride,
                                            const uint8_t *a_ptr, int a_stride,
                                            const uint8_t *b_ptr, int b_stride,
                                            const uint8_t *m_ptr, int m_stride,
                                            int width, int height) {
  int x, y;
  __m128i res = _mm_setzero_si128();
  const __m128i mask_max = _mm_set1_epi8((1 << AOM_BLEND_A64_ROUND_BITS));

  for (y = 0; y < height; y++) {
    for (x = 0; x < width; x += 16) {
      const __m128i src = _mm_loadu_si128((const __m128i *)&src_ptr[x]);
      const __m128i a = _mm_loadu_si128((const __m128i *)&a_ptr[x]);
      const __m128i b = _mm_loadu_si128((const __m128i *)&b_ptr[x]);
      const __m128i m = _mm_loadu_si128((const __m128i *)&m_ptr[x]);
      const __m128i m_inv = _mm_sub_epi8(mask_max, m);

      // Calculate 16 predicted pixels.
      // Note that the maximum value of any entry of 'pred_l' or 'pred_r'
      // is 64 * 255, so we have plenty of space to add rounding constants.
      const __m128i data_l = _mm_unpacklo_epi8(a, b);
      const __m128i mask_l = _mm_unpacklo_epi8(m, m_inv);
      __m128i pred_l = _mm_maddubs_epi16(data_l, mask_l);
      pred_l = xx_roundn_epu16(pred_l, AOM_BLEND_A64_ROUND_BITS);

      const __m128i data_r = _mm_unpackhi_epi8(a, b);
      const __m128i mask_r = _mm_unpackhi_epi8(m, m_inv);
      __m128i pred_r = _mm_maddubs_epi16(data_r, mask_r);
      pred_r = xx_roundn_epu16(pred_r, AOM_BLEND_A64_ROUND_BITS);

      const __m128i pred = _mm_packus_epi16(pred_l, pred_r);
      res = _mm_add_epi32(res, _mm_sad_epu8(pred, src));
    }

    src_ptr += src_stride;
    a_ptr += a_stride;
    b_ptr += b_stride;
    m_ptr += m_stride;
  }
  // At this point, we have two 32-bit partial SADs in lanes 0 and 2 of 'res'.
  unsigned int sad = (unsigned int)(_mm_cvtsi128_si32(res) +
                                    _mm_cvtsi128_si32(_mm_srli_si128(res, 8)));
  return sad;
}